

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extradata.cpp
# Opt level: O0

int32_t __thiscall
icu_63::ExtraData::writeNoNoMapping
          (ExtraData *this,UChar32 c,Norm *norm,UnicodeString *dataString,
          Hashtable *previousMappings)

{
  undefined8 this_00;
  int32_t iVar1;
  int32_t iVar2;
  UErrorCode *status;
  undefined1 local_a0 [8];
  IcuToolErrorCode errorCode;
  int32_t previousOffset;
  int local_74;
  undefined1 local_70 [4];
  int32_t offset;
  UnicodeString newMapping;
  Hashtable *previousMappings_local;
  UnicodeString *dataString_local;
  Norm *norm_local;
  UChar32 c_local;
  ExtraData *this_local;
  
  newMapping.fUnion._48_8_ = previousMappings;
  UnicodeString::UnicodeString((UnicodeString *)local_70);
  iVar1 = writeMapping(this,c,norm,(UnicodeString *)local_70);
  errorCode.location._0_4_ =
       Hashtable::geti((Hashtable *)newMapping.fUnion._48_8_,(UnicodeString *)local_70);
  if ((int32_t)errorCode.location == 0) {
    iVar2 = UnicodeString::length(dataString);
    local_74 = iVar2 + iVar1;
    UnicodeString::append(dataString,(UnicodeString *)local_70);
    IcuToolErrorCode::IcuToolErrorCode
              ((IcuToolErrorCode *)local_a0,"gennorm2/writeExtraData()/Hashtable.puti()");
    this_00 = newMapping.fUnion._48_8_;
    status = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)local_a0);
    Hashtable::puti((Hashtable *)this_00,(UnicodeString *)local_70,local_74 + 1,status);
    IcuToolErrorCode::~IcuToolErrorCode((IcuToolErrorCode *)local_a0);
  }
  else {
    local_74 = (int32_t)errorCode.location + -1;
  }
  UnicodeString::~UnicodeString((UnicodeString *)local_70);
  return local_74;
}

Assistant:

int32_t ExtraData::writeNoNoMapping(UChar32 c, const Norm &norm,
                                    UnicodeString &dataString,
                                    Hashtable &previousMappings) {
    UnicodeString newMapping;
    int32_t offset=writeMapping(c, norm, newMapping);
    int32_t previousOffset=previousMappings.geti(newMapping);
    if(previousOffset!=0) {
        // Duplicate, point to the identical mapping that has already been stored.
        offset=previousOffset-1;
    } else {
        // Append this new mapping and
        // enter it into the hashtable, avoiding value 0 which is "not found".
        offset=dataString.length()+offset;
        dataString.append(newMapping);
        IcuToolErrorCode errorCode("gennorm2/writeExtraData()/Hashtable.puti()");
        previousMappings.puti(newMapping, offset+1, errorCode);
    }
    return offset;
}